

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

void __thiscall
wasm::BranchUtils::BranchTargets::BranchTargets(BranchTargets *this,Expression *expr)

{
  Expression *local_20;
  Expression *expr_local;
  
  local_20 = expr;
  Inner::Inner(&this->inner);
  Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ::walk((Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
          *)this,&local_20);
  return;
}

Assistant:

BranchTargets(Expression* expr) { inner.walk(expr); }